

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameParentFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  uchar *puVar2;
  char *pcVar3;
  void *pvVar4;
  char *pcVar5;
  char *p;
  sqlite3 *db;
  size_t __n;
  uchar *puVar6;
  uchar *z;
  int token;
  int local_54;
  sqlite3 *local_50;
  void *local_48;
  char *local_40;
  sqlite3_context *local_38;
  
  db = context->pOut->db;
  puVar2 = (uchar *)sqlite3ValueText(*argv,'\x01');
  pcVar3 = (char *)sqlite3ValueText(argv[1],'\x01');
  pvVar4 = sqlite3ValueText(argv[2],'\x01');
  if (pcVar3 != (char *)0x0 && puVar2 != (uchar *)0x0) {
    local_38 = context;
    if (*puVar2 == '\0') {
      p = (char *)0x0;
    }
    else {
      p = (char *)0x0;
      z = puVar2;
      local_48 = pvVar4;
      local_40 = pcVar3;
      do {
        iVar1 = sqlite3GetToken(z,&local_54);
        if (local_54 == 0x69) {
          do {
            puVar6 = z;
            z = puVar6 + iVar1;
            iVar1 = sqlite3GetToken(z,&local_54);
          } while (local_54 == 0xa3);
          if ((local_54 == 0xa4) || (puVar6 == (uchar *)0x0)) break;
          __n = (size_t)iVar1;
          local_50 = db;
          pcVar3 = (char *)sqlite3DbMallocRawNN(db,__n + 1);
          db = local_50;
          if (pcVar3 == (char *)0x0) break;
          memcpy(pcVar3,z,__n);
          pcVar3[__n] = '\0';
          sqlite3Dequote(pcVar3);
          iVar1 = sqlite3StrICmp(local_40,pcVar3);
          pcVar5 = p;
          if (iVar1 == 0) {
            if (p == (char *)0x0) {
              pcVar5 = "";
            }
            pcVar5 = sqlite3MPrintf(local_50,"%s%.*s\"%w\"",pcVar5,
                                    (ulong)(uint)((int)z - (int)puVar2),puVar2,local_48);
            if (p != (char *)0x0) {
              sqlite3DbFreeNN(local_50,p);
            }
            puVar2 = z + __n;
          }
          db = local_50;
          sqlite3DbFreeNN(local_50,pcVar3);
          p = pcVar5;
        }
        else {
          __n = (size_t)iVar1;
        }
        puVar6 = z + __n;
        z = z + __n;
      } while (*puVar6 != '\0');
    }
    pcVar3 = "";
    if (p != (char *)0x0) {
      pcVar3 = p;
    }
    pcVar3 = sqlite3MPrintf(db,"%s%s",pcVar3,puVar2);
    setResultStrOrError(local_38,pcVar3,-1,'\x01',sqlite3MallocSize);
    if (p != (char *)0x0) {
      sqlite3DbFreeNN(db,p);
      return;
    }
  }
  return;
}

Assistant:

static void renameParentFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zOutput = 0;
  char *zResult;
  unsigned char const *zInput = sqlite3_value_text(argv[0]);
  unsigned char const *zOld = sqlite3_value_text(argv[1]);
  unsigned char const *zNew = sqlite3_value_text(argv[2]);

  unsigned const char *z;         /* Pointer to token */
  int n;                          /* Length of token z */
  int token;                      /* Type of token */

  UNUSED_PARAMETER(NotUsed);
  if( zInput==0 || zOld==0 ) return;
  for(z=zInput; *z; z=z+n){
    n = sqlite3GetToken(z, &token);
    if( token==TK_REFERENCES ){
      char *zParent;
      do {
        z += n;
        n = sqlite3GetToken(z, &token);
      }while( token==TK_SPACE );

      if( token==TK_ILLEGAL ) break;
      zParent = sqlite3DbStrNDup(db, (const char *)z, n);
      if( zParent==0 ) break;
      sqlite3Dequote(zParent);
      if( 0==sqlite3StrICmp((const char *)zOld, zParent) ){
        char *zOut = sqlite3MPrintf(db, "%s%.*s\"%w\"", 
            (zOutput?zOutput:""), (int)(z-zInput), zInput, (const char *)zNew
        );
        sqlite3DbFree(db, zOutput);
        zOutput = zOut;
        zInput = &z[n];
      }
      sqlite3DbFree(db, zParent);
    }
  }

  zResult = sqlite3MPrintf(db, "%s%s", (zOutput?zOutput:""), zInput), 
  sqlite3_result_text(context, zResult, -1, SQLITE_DYNAMIC);
  sqlite3DbFree(db, zOutput);
}